

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void max_w_cb(Fl_Value_Input *i,void *v)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  Fl_Type *pFVar4;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar3 != 0) {
      Fl_Valuator::value(&i->super_Fl_Valuator,(double)*(int *)&current_widget[1].super_Fl_Type.next
                        );
      return;
    }
  }
  else if (Fl_Type::first != (Fl_Type *)0x0) {
    dVar1 = (i->super_Fl_Valuator).value_;
    bVar2 = false;
    pFVar4 = Fl_Type::first;
    do {
      if (pFVar4->selected != '\0') {
        iVar3 = (*pFVar4->_vptr_Fl_Type[0x21])(pFVar4);
        if (iVar3 != 0) {
          *(int *)&current_widget[1].super_Fl_Type.next = (int)dVar1;
          bVar2 = true;
        }
      }
      pFVar4 = pFVar4->next;
    } while (pFVar4 != (Fl_Type *)0x0);
    if (bVar2) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void max_w_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (!current_widget->is_window()) return;
    i->value(((Fl_Window_Type*)current_widget)->sr_max_w);
  } else {
    int mod = 0;
    int n = (int)i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_window()) {
        ((Fl_Window_Type*)current_widget)->sr_max_w = n;
        mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}